

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

ElementsDecodeRawTransactionResponseStruct * __thiscall
cfd::api::json::ElementsDecodeRawTransactionResponse::ConvertToStruct
          (ElementsDecodeRawTransactionResponseStruct *__return_storage_ptr__,
          ElementsDecodeRawTransactionResponse *this)

{
  int64_t iVar1;
  vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
  local_30;
  
  ElementsDecodeRawTransactionResponseStruct::ElementsDecodeRawTransactionResponseStruct
            (__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->hash);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->wtxid);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->withash);
  __return_storage_ptr__->version = this->version_;
  iVar1 = this->vsize_;
  __return_storage_ptr__->size = this->size_;
  __return_storage_ptr__->vsize = iVar1;
  __return_storage_ptr__->weight = this->weight_;
  __return_storage_ptr__->locktime = this->locktime_;
  core::
  JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_ElementsDecodeRawTransactionTxInStruct>
  ::ConvertToStruct(&local_30,&this->vin_);
  std::
  vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
  ::_M_move_assign(&__return_storage_ptr__->vin,&local_30);
  std::
  vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
  ::~vector(&local_30);
  core::
  JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
  ::ConvertToStruct((vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
                     *)&local_30,&this->vout_);
  std::
  vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
  ::_M_move_assign(&__return_storage_ptr__->vout,&local_30);
  std::
  vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
  ::~vector((vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
             *)&local_30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

ElementsDecodeRawTransactionResponseStruct ElementsDecodeRawTransactionResponse::ConvertToStruct() const {  // NOLINT
  ElementsDecodeRawTransactionResponseStruct result;
  result.txid = txid_;
  result.hash = hash_;
  result.wtxid = wtxid_;
  result.withash = withash_;
  result.version = version_;
  result.size = size_;
  result.vsize = vsize_;
  result.weight = weight_;
  result.locktime = locktime_;
  result.vin = vin_.ConvertToStruct();
  result.vout = vout_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}